

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

GLuint __thiscall
gl4cts::GPUShaderFP64Test2::getAmountUniforms
          (GPUShaderFP64Test2 *this,shaderStage shader_stage,uniformTypeDetails *uniform_type)

{
  uint uVar1;
  GLuint GVar2;
  GLuint GVar3;
  GLuint GVar4;
  uint uVar5;
  int iVar6;
  
  GVar2 = getMaxUniformComponents(this,shader_stage);
  GVar3 = uniform_type->m_n_rows;
  if (uniform_type->m_n_columns == 1) {
    uVar5 = GVar3 * 2;
  }
  else {
    iVar6 = 8;
    if (GVar3 != 3) {
      iVar6 = GVar3 * 2;
    }
    uVar5 = iVar6 * uniform_type->m_n_columns;
  }
  GVar3 = getMaxUniformBlockSize(this);
  GVar4 = getUniformTypeMemberSize(this,uniform_type);
  uVar1 = GVar3 / GVar4;
  if (GVar2 / uVar5 <= GVar3 / GVar4) {
    uVar1 = GVar2 / uVar5;
  }
  return uVar1;
}

Assistant:

glw::GLuint GPUShaderFP64Test2::getAmountUniforms(shaderStage				shader_stage,
												  const uniformTypeDetails& uniform_type) const
{
	const glw::GLuint max_uniform_components   = getMaxUniformComponents(shader_stage);
	const glw::GLuint required_components	  = getRequiredComponentsNumber(uniform_type);
	const glw::GLuint n_uniforms			   = max_uniform_components / required_components;
	const glw::GLuint max_uniform_block_size   = getMaxUniformBlockSize();
	const glw::GLuint uniform_type_member_size = getUniformTypeMemberSize(uniform_type);
	const glw::GLuint max_uniforms			   = max_uniform_block_size / uniform_type_member_size;

	return max_uniforms < n_uniforms ? max_uniforms : n_uniforms;
}